

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O1

void __thiscall chrono::ChLinkRackpinion::UpdateTime(ChLinkRackpinion *this,double mytime)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ChFrame<double> abs_contact;
  ChFrame<double> mrotframe;
  ChMatrix33<double> ma1;
  ChMatrix33<double> local_2e0;
  ChFrame<double> local_298;
  ChFrame<double> local_210;
  ChFrame<double> local_188;
  ChFrame<double> local_100;
  ChMatrix33<double> local_78;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar53 [16];
  
  ChLink::UpdateTime((ChLink *)this,mytime);
  local_188._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_188.coord.pos.m_data[0] = 0.0;
  local_188.coord.pos.m_data[1] = 0.0;
  local_188.coord.pos.m_data[2] = 0.0;
  local_298._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_298.coord.pos.m_data[0] = 0.0;
  local_298.coord.pos.m_data[1] = 0.0;
  local_298.coord.pos.m_data[2] = 0.0;
  local_298.coord.rot.m_data[0] = 1.0;
  local_298.coord.rot.m_data[1] = 0.0;
  local_298.coord.rot.m_data[2] = 0.0;
  local_298.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_298.Amatrix,(ChQuaternion<double> *)&local_188);
  local_210._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_210.coord.pos.m_data[0] = 0.0;
  local_210.coord.pos.m_data[1] = 0.0;
  local_210.coord.pos.m_data[2] = 0.0;
  local_188._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_188.coord.pos.m_data[0] = 0.0;
  local_188.coord.pos.m_data[1] = 0.0;
  local_188.coord.pos.m_data[2] = 0.0;
  local_188.coord.rot.m_data[0] = 1.0;
  local_188.coord.rot.m_data[1] = 0.0;
  local_188.coord.rot.m_data[2] = 0.0;
  local_188.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_188.Amatrix,(ChQuaternion<double> *)&local_210);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1,
             &this->local_pinion,&local_298);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2,
             &this->local_rack,&local_188);
  dVar8 = local_298.coord.pos.m_data[0] - local_188.coord.pos.m_data[0];
  dVar18 = local_298.coord.pos.m_data[1] - local_188.coord.pos.m_data[1];
  dVar1 = local_298.coord.pos.m_data[2] - local_188.coord.pos.m_data[2];
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar13 = ZEXT816(0) << 0x40;
  if ((((local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
         0.0) || (NAN(local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[2]))) ||
      (local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] != 0.0
      )) || (((NAN(local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5]) ||
              (local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8] != 0.0)) ||
             (NAN(local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8]))))) {
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
         local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar13 = vfmadd231sd_fma(auVar19,auVar43,auVar43);
    auVar13 = vfmadd231sd_fma(auVar13,auVar51,auVar51);
    if (auVar13._0_8_ < 0.0) {
      dVar16 = sqrt(auVar13._0_8_);
    }
    else {
      auVar13 = vsqrtsd_avx(auVar13,auVar13);
      dVar16 = auVar13._0_8_;
    }
    bVar7 = 2.2250738585072014e-308 <= dVar16;
    dVar16 = 1.0 / dVar16;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (ulong)bVar7 *
         (long)(local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5] * dVar16);
    auVar9._0_8_ = (ulong)bVar7 *
                   (long)(local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[2] * dVar16) + (ulong)!bVar7 * 0x3ff0000000000000;
    auVar9._8_8_ = 0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (ulong)bVar7 *
         (long)(local_298.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8] * dVar16);
  }
  else {
    auVar9 = ZEXT816(0x3ff0000000000000);
    auVar10 = ZEXT816(0);
  }
  dVar47 = auVar10._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       dVar47;
  auVar43 = vfmsub231sd_fma(auVar37,auVar13,auVar40);
  dVar16 = auVar43._0_8_;
  dVar46 = auVar9._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       dVar46 * local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [6];
  auVar51 = vfmsub231sd_fma(auVar31,auVar10,auVar11);
  dVar45 = auVar13._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       dVar45;
  auVar19 = vfmsub231sd_fma(auVar52,auVar9,auVar12);
  dVar50 = auVar19._0_8_;
  dVar30 = auVar51._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar30 * dVar30;
  auVar43 = vfmadd231sd_fma(auVar20,auVar43,auVar43);
  auVar43 = vfmadd231sd_fma(auVar43,auVar19,auVar19);
  if (auVar43._0_8_ < 0.0) {
    dVar17 = sqrt(auVar43._0_8_);
  }
  else {
    auVar43 = vsqrtsd_avx(auVar43,auVar43);
    dVar17 = auVar43._0_8_;
  }
  auVar48._8_8_ = 0x8000000000000000;
  auVar48._0_8_ = 0x8000000000000000;
  if (0.0001 <= dVar17) goto LAB_005b8337;
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar11 = vandpd_avx512vl(auVar11,auVar2);
  if (0.9 <= auVar11._0_8_) {
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar11 = vandpd_avx512vl(auVar12,auVar5);
    if (0.9 <= auVar11._0_8_) {
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar11 = vandpd_avx512vl(auVar40,auVar6);
      auVar40 = SUB6416(ZEXT864(0),0) << 0x40;
      if (0.9 <= auVar11._0_8_) goto LAB_005b82b1;
      auVar11 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar40 = ZEXT816(0x3ff0000000000000);
LAB_005b82b1:
      auVar11 = ZEXT816(0);
    }
    auVar43 = ZEXT816(0) << 0x40;
  }
  else {
    auVar43 = ZEXT816(0x3ff0000000000000);
    auVar11 = ZEXT816(0);
    auVar40 = ZEXT816(0) << 0x40;
  }
  auVar38._8_8_ = 0;
  auVar38._0_8_ = auVar40._0_8_ * -dVar47;
  auVar12 = vfmadd231sd_fma(auVar38,auVar13,auVar11);
  dVar16 = auVar12._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar11._0_8_ * -dVar46;
  auVar11 = vfmadd231sd_fma(auVar32,auVar10,auVar43);
  dVar30 = auVar11._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = auVar43._0_8_ * -dVar45;
  auVar11 = vfmadd231sd_fma(auVar53,auVar9,auVar40);
  dVar50 = auVar11._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar30 * dVar30;
  auVar40 = vfmadd231sd_fma(auVar21,auVar12,auVar12);
  auVar11 = vfmadd231sd_fma(auVar40,auVar11,auVar11);
  if (auVar11._0_8_ < 0.0) {
    dVar17 = sqrt(auVar11._0_8_);
  }
  else {
    auVar11 = vsqrtsd_avx(auVar11,auVar11);
    dVar17 = auVar11._0_8_;
  }
LAB_005b8337:
  dVar17 = 1.0 / dVar17;
  dVar16 = dVar16 * dVar17;
  dVar30 = dVar30 * dVar17;
  dVar50 = dVar50 * dVar17;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar30;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar45 * dVar50;
  auVar11 = vfmsub231sd_fma(auVar54,auVar44,auVar10);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar50;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar47 * dVar16;
  auVar40 = vfmsub231sd_fma(auVar55,auVar42,auVar9);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar16;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar46 * dVar30;
  auVar43 = vfmsub231sd_fma(auVar56,auVar49,auVar13);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar8;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar18 * dVar30;
  auVar13 = vfmadd231sd_fma(auVar22,auVar49,auVar29);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1;
  auVar13 = vfmadd231sd_fma(auVar13,auVar42,auVar33);
  dVar8 = dVar16 * auVar13._0_8_;
  dVar1 = dVar30 * auVar13._0_8_;
  auVar12 = vmulsd_avx512f(auVar42,auVar13);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1 * dVar18;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar8;
  auVar13 = vfmadd231sd_fma(auVar23,auVar41,auVar29);
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar12,auVar33);
  bVar7 = 0.0 < auVar13._0_8_;
  auVar13 = vxorpd_avx512vl(auVar12,auVar48);
  auVar14._0_8_ = (double)((ulong)bVar7 * (long)-dVar8 + (ulong)!bVar7 * (long)dVar8);
  auVar14._8_8_ = 0;
  dVar8 = (double)((ulong)bVar7 * (long)-dVar1 + (ulong)!bVar7 * (long)dVar1);
  auVar15._0_8_ = (ulong)bVar7 * auVar13._0_8_ + (ulong)!bVar7 * auVar12._0_8_;
  auVar15._8_8_ = auVar12._8_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar8 * dVar8;
  auVar13 = vfmadd231sd_fma(auVar24,auVar14,auVar14);
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar15,auVar15);
  if (auVar13._0_8_ < 0.0) {
    dVar18 = sqrt(auVar13._0_8_);
  }
  else {
    auVar13 = vsqrtsd_avx(auVar13,auVar13);
    dVar18 = auVar13._0_8_;
  }
  dVar1 = this->R;
  bVar7 = 2.2250738585072014e-308 <= dVar18;
  auVar25._0_8_ = 1.0 / dVar18;
  auVar25._8_8_ = 0;
  auVar13 = vmulsd_avx512f(auVar25,auVar15);
  (this->contact_pt).m_data[0] =
       dVar1 * (double)((ulong)bVar7 * (long)(auVar25._0_8_ * auVar14._0_8_) +
                       (ulong)!bVar7 * 0x3ff0000000000000) + local_298.coord.pos.m_data[0];
  (this->contact_pt).m_data[1] =
       dVar1 * (double)((ulong)bVar7 * (long)(dVar8 * auVar25._0_8_)) +
       local_298.coord.pos.m_data[1];
  (this->contact_pt).m_data[2] =
       dVar1 * (double)((ulong)bVar7 * auVar13._0_8_) + local_298.coord.pos.m_data[2];
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar11._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar16;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar46;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar40._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar30;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar45;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar43._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar50;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar47;
  ChFrame<double>::ChFrame(&local_210,&this->contact_pt,&local_78);
  dVar8 = this->beta;
  dVar18 = cos(dVar8);
  auVar27._0_8_ = sin(dVar8);
  auVar27._8_56_ = extraout_var;
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       dVar18 * 0.0;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar13 = vxorpd_avx512vl(auVar27._0_16_,auVar3);
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)vmovlpd_avx(auVar13);
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar27._0_8_ * 0.0;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar13 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar34,ZEXT816(0) << 0x40);
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar13._0_8_;
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar27._0_8_ + 0.0;
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar18;
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar18;
  ChFrame<double>::ChFrame(&local_100,(ChVector<double> *)&VNULL,&local_2e0);
  ChFrame<double>::ConcatenatePostTransformation(&local_210,&local_100);
  dVar8 = this->alpha;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar8;
  if (0.0 <= (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.react_force.m_data[0]) {
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar13 = vxorpd_avx512vl(auVar26,auVar4);
    dVar8 = auVar13._0_8_;
  }
  dVar18 = cos(dVar8);
  auVar28._0_8_ = sin(dVar8);
  auVar28._8_56_ = extraout_var_00;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar18;
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = -0.0;
  auVar11 = auVar28._0_16_;
  auVar13 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar39,auVar11);
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar13._0_8_;
  auVar13 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar11,auVar39);
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar13._0_8_;
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar28._0_8_ * 0.0;
  auVar13 = vfmadd231sd_fma(auVar35,auVar39,ZEXT816(0) << 0x40);
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar13._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar18 * -0.0;
  auVar13 = vfmadd231sd_fma(auVar36,auVar11,ZEXT816(0) << 0x40);
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar13._0_8_;
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar18;
  local_2e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar28._0_8_;
  ChFrame<double>::SetRot(&local_100,&local_2e0);
  ChFrame<double>::ConcatenatePostTransformation(&local_210,&local_100);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1,
             &local_210,&(this->super_ChLinkMateGeneric).frame1);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2,
             &local_210,&(this->super_ChLinkMateGeneric).frame2);
  return;
}

Assistant:

void ChLinkRackpinion::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkMateGeneric::UpdateTime(mytime);

    ChFrame<double> abs_pinion;
    ChFrame<double> abs_rack;

    ((ChFrame<double>*)Body1)->TransformLocalToParent(local_pinion, abs_pinion);
    ((ChFrame<double>*)Body2)->TransformLocalToParent(local_rack, abs_rack);

    ChVector<> abs_distpr = abs_pinion.GetPos() - abs_rack.GetPos();
    ChVector<> abs_Dpin = abs_pinion.GetA().Get_A_Zaxis();
    ChVector<> abs_Dx;
    ChVector<> abs_Dy;
    ChVector<> abs_Dz;
    abs_Dpin.DirToDxDyDz(abs_Dz, abs_Dx, abs_Dy,
                         abs_rack.GetA().Get_A_Xaxis());  // with z as pinion shaft and x as suggested rack X dir

    /*
    GetLog() << "abs_distpr " << abs_distpr << "\n";
    GetLog() << "abs_rack Xaxis()" << abs_rack.GetA()->Get_A_Xaxis() << "\n";
    GetLog() << "abs_Dpin " << abs_Dpin << "\n";
    GetLog() << "abs_Dx " << abs_Dx << "\n";
    */

    ChVector<> abs_Ro = abs_Dy * Vdot(abs_Dy, abs_distpr);

    if (Vdot(abs_Ro, abs_distpr) > 0)
        abs_Ro = -abs_Ro;

    ChVector<> abs_Dr = abs_Ro.GetNormalized();
    ChVector<> abs_R = abs_Dr * this->GetPinionRadius();
    this->contact_pt = abs_pinion.GetPos() + abs_R;

    // Absolute frame of link reference
    ChMatrix33<> ma1(abs_Dx, abs_Dy, abs_Dz);
    ChFrame<> abs_contact(this->contact_pt, ma1);

    ChMatrix33<> mrot;

    // rotate link frame on its Y because of beta
    mrot.Set_A_Rxyz(ChVector<>(0, this->beta, 0));
    ChFrame<> mrotframe(VNULL, mrot);
    abs_contact.ConcatenatePostTransformation(mrotframe);  // or: abs_contact *= mrotframe;

    // rotate link frame on its Z because of alpha
    if (this->react_force.x() < 0)
        mrot.Set_A_Rxyz(ChVector<>(0, 0, this->alpha));
    else
        mrot.Set_A_Rxyz(ChVector<>(0, 0, -this->alpha));
    mrotframe.SetRot(mrot);
    abs_contact.ConcatenatePostTransformation(mrotframe);  // or: abs_contact *= mrotframe;

    // Set the link frame 'abs_contact' to relative frames to the two connected ChBodyFrame
    ((ChFrame<double>*)Body1)->TransformParentToLocal(abs_contact, this->frame1);
    ((ChFrame<double>*)Body2)->TransformParentToLocal(abs_contact, this->frame2);
}